

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

Status __thiscall
leveldb::DBConstructor::FinishImpl(DBConstructor *this,Options *options,KVMap *data)

{
  long *plVar1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  WriteOptions local_241;
  Status local_240;
  Tester local_238;
  Slice local_98 [2];
  Slice local_78;
  undefined1 local_68 [8];
  WriteBatch batch;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kvp;
  const_iterator __end2;
  const_iterator __begin2;
  KVMap *__range2;
  KVMap *data_local;
  Options *options_local;
  DBConstructor *this_local;
  
  if (*(long **)&options->block_restart_interval != (long *)0x0) {
    (**(code **)(**(long **)&options->block_restart_interval + 8))();
  }
  *(undefined8 *)&options->block_restart_interval = 0;
  NewDB((DBConstructor *)options);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(in_RCX);
  kvp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_RCX);
  while( true ) {
    bVar2 = std::operator!=(&__end2,(_Self *)&kvp);
    if (!bVar2) break;
    batch._24_8_ = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2);
    WriteBatch::WriteBatch((WriteBatch *)local_68);
    Slice::Slice(&local_78,(string *)batch._24_8_);
    Slice::Slice(local_98,(string *)(batch._24_8_ + 0x20));
    WriteBatch::Put((WriteBatch *)local_68,&local_78,local_98);
    test::Tester::Tester
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
               ,0x157);
    plVar1 = *(long **)&options->block_restart_interval;
    local_241.sync = false;
    WriteOptions::WriteOptions(&local_241);
    (**(code **)(*plVar1 + 0x20))(&local_240,plVar1,&local_241,local_68);
    bVar2 = Status::ok(&local_240);
    test::Tester::Is(&local_238,bVar2,"db_->Write(WriteOptions(), &batch).ok()");
    Status::~Status(&local_240);
    test::Tester::~Tester(&local_238);
    WriteBatch::~WriteBatch((WriteBatch *)local_68);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  Status::OK();
  return (Status)(char *)this;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete db_;
    db_ = nullptr;
    NewDB();
    for (const auto& kvp : data) {
      WriteBatch batch;
      batch.Put(kvp.first, kvp.second);
      ASSERT_TRUE(db_->Write(WriteOptions(), &batch).ok());
    }
    return Status::OK();
  }